

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizerAndResolverTester.cpp
# Opt level: O0

void __thiscall
psy::C::TypeCanonicalizerAndResolverTester::case0029(TypeCanonicalizerAndResolverTester *this)

{
  Expectation *pEVar1;
  Decl *pDVar2;
  allocator<char> local_391;
  string local_390;
  Decl local_370;
  Decl local_2a8;
  string local_1e0;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  TypeCanonicalizerAndResolverTester *this_local;
  
  local_18 = "\nstruct x { int y ; } ; void f ( ) { union x z ; }\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\nstruct x { int y ; } ; void f ( ) { union x z ; }\n",&local_39);
  Expectation::Expectation(&local_1c0);
  std::__cxx11::string::string
            ((string *)&local_1e0,
             (string *)
             &TypeCanonicalizer::DiagnosticsReporter::
              ID_of_TagTypeDoesNotMatchTagDeclaration_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1c0,Error,&local_1e0);
  Decl::Decl(&local_370);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"z",&local_391);
  pDVar2 = Decl::Object(&local_370,&local_390,VariableDeclaration,Block);
  pDVar2 = Ty::Unknown(&pDVar2->ty_);
  Decl::Decl(&local_2a8,pDVar2);
  pEVar1 = Expectation::declaration(pEVar1,&local_2a8);
  Expectation::Expectation(&local_108,pEVar1);
  canonicalizerAndResolveTypes(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  Decl::~Decl(&local_2a8);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  Decl::~Decl(&local_370);
  std::__cxx11::string::~string((string *)&local_1e0);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void TypeCanonicalizerAndResolverTester::case0029()
{
    auto s = R"(
struct x { int y ; } ; void f ( ) { union x z ; }
)";

    canonicalizerAndResolveTypes(s,
            Expectation()
            .diagnostic(Expectation::ErrorOrWarn::Error,
                        TypeCanonicalizer::DiagnosticsReporter::ID_of_TagTypeDoesNotMatchTagDeclaration)
            .declaration(
                Decl().Object("z", SymbolKind::VariableDeclaration, ScopeKind::Block)
                      .ty_.Unknown()));
}